

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O0

void __thiscall TorController::Reconnect(TorController *this)

{
  long lVar1;
  undefined1 uVar2;
  byte bVar3;
  ConnectionCB *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000080;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  _Placeholder<1> *in_stack_fffffffffffffed0;
  TorController **in_stack_fffffffffffffed8;
  _Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>))(TorControlConnection_&)>
  *in_stack_fffffffffffffee0;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  ConnectionCB *flag;
  int in_stack_ffffffffffffff3c;
  ConnectionCB *in_stack_ffffffffffffff50;
  code *tor_control_center;
  TorControlConnection *this_00;
  ConstevalFormatString<1U> in_stack_ffffffffffffff78;
  string_view in_stack_ffffffffffffff80;
  string_view in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  flag = in_RDI;
  std::bind<void(TorController::*)(TorControlConnection&),TorController*,std::_Placeholder<1>const&>
            (&in_stack_fffffffffffffee0->_M_f,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::function<void(TorControlConnection&)>::
  function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>))(TorControlConnection&)>,void>
            ((function<void_(TorControlConnection_&)> *)
             CONCAT17(in_stack_fffffffffffffeef,
                      CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)),
             in_stack_fffffffffffffee0);
  tor_control_center = disconnected_cb;
  this_00 = (TorControlConnection *)0x0;
  std::bind<void(TorController::*)(TorControlConnection&),TorController*,std::_Placeholder<1>const&>
            (&in_stack_fffffffffffffee0->_M_f,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::function<void(TorControlConnection&)>::
  function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>))(TorControlConnection&)>,void>
            ((function<void_(TorControlConnection_&)> *)
             CONCAT17(in_stack_fffffffffffffeef,
                      CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)),
             in_stack_fffffffffffffee0);
  uVar2 = TorControlConnection::Connect
                    (this_00,(string *)tor_control_center,in_RDI,in_stack_ffffffffffffff50);
  bVar3 = uVar2 ^ 0xff;
  std::function<void_(TorControlConnection_&)>::~function
            ((function<void_(TorControlConnection_&)> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  std::function<void_(TorControlConnection_&)>::~function
            ((function<void_(TorControlConnection_&)> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  if ((bVar3 & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffee8)),
               (char *)in_stack_fffffffffffffee0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffee8)),
               (char *)in_stack_fffffffffffffee0);
    LogPrintFormatInternal<std::__cxx11::string>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff80,in_stack_ffffffffffffff3c,
               (LogFlags)flag,in_stack_00000070,in_stack_ffffffffffffff78,in_stack_00000080);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TorController::Reconnect()
{
    /* Try to reconnect and reestablish if we get booted - for example, Tor
     * may be restarting.
     */
    if (!conn.Connect(m_tor_control_center, std::bind(&TorController::connected_cb, this, std::placeholders::_1),
         std::bind(&TorController::disconnected_cb, this, std::placeholders::_1) )) {
        LogPrintf("tor: Re-initiating connection to Tor control port %s failed\n", m_tor_control_center);
    }
}